

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O3

bool __thiscall fp::Algorithm::IsVisited(Algorithm *this,array<int,_2UL> cur_node)

{
  undefined1 extraout_AL;
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  
  uVar1 = (ulong)cur_node._M_elems[0];
  uVar2 = uVar1;
  if ((uVar1 < 0x10) && (uVar2 = (long)cur_node._M_elems >> 0x20, uVar2 < 0x10)) {
    return (this->visited_node_)._M_elems[uVar1]._M_elems[uVar2];
  }
  pcVar3 = "array::at: __n (which is %zu) >= _Nm (which is %zu)";
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar2,0x10);
  pcVar3[2] = '\0';
  API::clearAllColor();
  API::setColor(0,0,'g');
  API::setColor(*(int *)(pcVar3 + 0xc6d4),0xf - *(int *)(pcVar3 + 0xc6d0),'w');
  API::setColor(*(int *)(pcVar3 + 0xc6dc),0xf - *(int *)(pcVar3 + 0xc6d8),'w');
  API::setColor(*(int *)(pcVar3 + 0xc6e4),0xf - *(int *)(pcVar3 + 0xc6e0),'w');
  API::setColor(*(int *)(pcVar3 + 0xc6ec),0xf - *(int *)(pcVar3 + 0xc6e8),'w');
  return (bool)extraout_AL;
}

Assistant:

bool fp::Algorithm::IsVisited(std::array<int, 2> cur_node) {
    return this->visited_node_.at(cur_node.at(0)).at(cur_node.at(1));
}